

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O3

void __thiscall
soplex::SPxLPBase<double>::doAddRows(SPxLPBase<double> *this,LPRowSetBase<double> *set,bool scale)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Item *pIVar4;
  bool bVar5;
  uint uVar6;
  double *pdVar7;
  Nonzero<double> *pNVar8;
  double dVar9;
  ulong uVar10;
  long lVar11;
  Nonzero<double> *pNVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  Item *pIVar17;
  double dVar18;
  DataArray<int> local_a0;
  double local_88;
  undefined8 uStack_80;
  DataKey local_70;
  LPColBase<double> local_68;
  
  iVar1 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  local_a0.data = (int *)0x0;
  local_a0.memFactor = 1.2;
  local_a0.thesize = 0;
  if (0 < iVar1) {
    local_a0.thesize = iVar1;
  }
  local_a0.themax = 1;
  if (0 < iVar1) {
    local_a0.themax = local_a0.thesize;
  }
  spx_alloc<int*>(&local_a0.data,local_a0.themax);
  iVar1 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
  uVar2 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  uVar6 = uVar2;
  if ((SPxLPBase<double> *)set != this) {
    LPRowSetBase<double>::add(&this->super_LPRowSetBase<double>,set);
    uVar6 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  }
  if (0 < (int)uVar6) {
    memset(local_a0.data,0,(ulong)uVar6 << 2);
  }
  dVar9 = (double)(long)(set->super_SVSetBase<double>).set.thenum;
  if (0 < (long)dVar9) {
    do {
      pIVar17 = (set->super_SVSetBase<double>).set.theitem;
      iVar16 = (set->super_SVSetBase<double>).set.thekey[(long)dVar9 + -1].idx;
      lVar13 = (long)pIVar17[iVar16].data.super_SVectorBase<double>.memused;
      local_88 = dVar9;
      if (0 < lVar13) {
        do {
          iVar3 = pIVar17[iVar16].data.super_SVectorBase<double>.m_elem[lVar13 + -1].idx;
          if ((this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum <= iVar3) {
            LPColBase<double>::LPColBase(&local_68,0);
            DataArray<int>::reSize(&local_a0,iVar3 + 1);
            iVar14 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
            lVar11 = (long)iVar14;
            if (iVar14 <= iVar3) {
              iVar14 = (iVar3 - iVar14) + 1;
              do {
                local_a0.data[lVar11] = 0;
                local_70.info = 0;
                local_70.idx = -1;
                LPColSetBase<double>::add(&this->super_LPColSetBase<double>,&local_70,&local_68);
                lVar11 = lVar11 + 1;
                iVar14 = iVar14 + -1;
              } while (iVar14 != 0);
            }
            local_68.vec._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_003ae9c8;
            if (local_68.vec.theelem != (Nonzero<double> *)0x0) {
              free(local_68.vec.theelem);
            }
          }
          local_a0.data[iVar3] = local_a0.data[iVar3] + 1;
          bVar5 = 1 < lVar13;
          lVar13 = lVar13 + -1;
        } while (bVar5);
      }
      dVar9 = (double)((long)local_88 + -1);
    } while (1 < (long)local_88);
  }
  lVar13 = (long)(this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  if (0 < lVar13) {
    uVar10 = lVar13 + 1;
    do {
      if (0 < local_a0.data[uVar10 - 2]) {
        pIVar17 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem +
                  (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[uVar10 - 2].
                  idx;
        iVar16 = local_a0.data[uVar10 - 2] + (pIVar17->data).super_SVectorBase<double>.memused;
        SVSetBase<double>::xtend
                  (&(this->super_LPColSetBase<double>).super_SVSetBase<double>,
                   (SVectorBase<double> *)pIVar17,iVar16);
        (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem
        [(this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[uVar10 - 2].idx].data
        .super_SVectorBase<double>.memused = iVar16;
      }
      uVar10 = uVar10 - 1;
    } while (1 < uVar10);
  }
  iVar16 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
  if (iVar1 < iVar16) {
    lVar13 = (long)iVar16;
    pdVar7 = (double *)__tls_get_addr(&PTR_003b4b70);
    local_88 = *pdVar7;
    uStack_80 = 0;
    dVar9 = -local_88;
    do {
      lVar11 = lVar13 + -1;
      lVar13 = lVar13 + -1;
      pIVar17 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
                (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[lVar11].idx;
      iVar16 = 0;
      if (scale) {
        iVar16 = (*this->lp_scaler->_vptr_SPxScaler[1])
                           (this->lp_scaler,pIVar17,&(this->super_LPColSetBase<double>).scaleExp);
        dVar18 = (this->super_LPRowSetBase<double>).right.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar13];
        ::soplex::infinity::__tls_init();
        if (dVar18 < local_88) {
          dVar18 = ldexp((this->super_LPRowSetBase<double>).right.val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar13],iVar16);
          (this->super_LPRowSetBase<double>).right.val.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar13] = dVar18;
        }
        dVar18 = (this->super_LPRowSetBase<double>).left.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar13];
        ::soplex::infinity::__tls_init();
        if (dVar9 < dVar18) {
          dVar18 = ldexp((this->super_LPRowSetBase<double>).left.val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar13],iVar16);
          (this->super_LPRowSetBase<double>).left.val.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar13] = dVar18;
        }
        dVar18 = ldexp((this->super_LPRowSetBase<double>).object.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar13],iVar16);
        (this->super_LPRowSetBase<double>).object.val.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [lVar13] = dVar18;
        (this->super_LPRowSetBase<double>).scaleExp.data[lVar13] = iVar16;
      }
      lVar11 = (long)(pIVar17->data).super_SVectorBase<double>.memused;
      if (0 < lVar11) {
        pNVar8 = (pIVar17->data).super_SVectorBase<double>.m_elem;
        uVar10 = lVar11 + 1;
        lVar11 = lVar11 << 4;
        do {
          iVar3 = *(int *)((long)pNVar8 + lVar11 + -8);
          pIVar4 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem;
          iVar14 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[iVar3].idx;
          lVar15 = (long)pIVar4[iVar14].data.super_SVectorBase<double>.memused -
                   (long)local_a0.data[iVar3];
          local_a0.data[iVar3] = local_a0.data[iVar3] + -1;
          pNVar12 = pIVar4[iVar14].data.super_SVectorBase<double>.m_elem;
          pNVar12[lVar15].idx = (int)lVar13;
          dVar18 = *(double *)((long)&pNVar8[-1].val + lVar11);
          if (scale) {
            dVar18 = ldexp(dVar18,(this->super_LPColSetBase<double>).scaleExp.data[iVar3] + iVar16);
            pNVar8 = (pIVar17->data).super_SVectorBase<double>.m_elem;
            *(double *)((long)&pNVar8[-1].val + lVar11) = dVar18;
            pNVar12 = pIVar4[iVar14].data.super_SVectorBase<double>.m_elem;
          }
          pNVar12[lVar15].val = dVar18;
          uVar10 = uVar10 - 1;
          lVar11 = lVar11 + -0x10;
        } while (1 < uVar10);
      }
    } while (iVar1 < lVar13);
    iVar16 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
  }
  (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x50])
            (this,(ulong)(uint)(iVar16 - iVar1));
  (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x51])
            (this,(ulong)((this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum -
                         uVar2));
  if (local_a0.data != (int *)0x0) {
    free(local_a0.data);
  }
  return;
}

Assistant:

void doAddRows(const LPRowSetBase<R>& set, bool scale = false)
   {
      int i, j, k, ii, idx;
      SVectorBase<R>* col;
      DataArray < int > newCols(nCols());
      int oldRowNumber = nRows();
      int oldColNumber = nCols();

      if(&set != this)
         LPRowSetBase<R>::add(set);

      assert(LPRowSetBase<R>::isConsistent());
      assert(LPColSetBase<R>::isConsistent());

      // count additional nonzeros per column
      for(i = nCols() - 1; i >= 0; --i)
         newCols[i] = 0;

      for(i = set.num() - 1; i >= 0; --i)
      {
         const SVectorBase<R>& vec = set.rowVector(i);

         for(j = vec.size() - 1; j >= 0; --j)
         {
            // create new columns if required
            ii = vec.index(j);

            if(ii >= nCols())
            {
               LPColBase<R> empty;
               newCols.reSize(ii + 1);

               for(k = nCols(); k <= ii; ++k)
               {
                  newCols[k] = 0;
                  LPColSetBase<R>::add(empty);
               }
            }

            assert(ii < nCols());
            newCols[ii]++;
         }
      }

      // extend columns as required (backward because of memory efficiency reasons)
      for(i = nCols() - 1; i >= 0; --i)
      {
         if(newCols[i] > 0)
         {
            int len = newCols[i] + colVector(i).size();
            LPColSetBase<R>::xtend(i, len);

            /* preset the sizes: beware that this can irritate a consistency check call from xtend(). We need to set the
             * sizes here, because a possible garbage collection called from xtend might destroy the sizes again. */
            colVector_w(i).set_size(len);
         }
      }

      // compute new row scaling factor and insert new elements to column file
      for(i = nRows() - 1; i >= oldRowNumber; --i)
      {
         SVectorBase<R>& vec = rowVector_w(i);
         int newRowScaleExp = 0;

         DataArray <int>& colscaleExp = LPColSetBase<R>::scaleExp;

         // compute new row scaling factor and apply it to the sides
         if(scale)
         {
            newRowScaleExp = lp_scaler->computeScaleExp(vec, colscaleExp);

            if(rhs(i) < R(infinity))
               rhs_w(i) = spxLdexp(rhs_w(i), newRowScaleExp);

            if(lhs(i) > R(-infinity))
               lhs_w(i) = spxLdexp(lhs_w(i), newRowScaleExp);

            maxRowObj_w(i) = spxLdexp(maxRowObj_w(i), newRowScaleExp);

            LPRowSetBase<R>::scaleExp[i] = newRowScaleExp;
         }

         for(j = vec.size() - 1; j >= 0; --j)
         {
            k = vec.index(j);
            col = &colVector_w(k);
            idx = col->size() - newCols[k];
            assert(newCols[k] > 0);
            assert(idx >= 0);
            newCols[k]--;
            col->index(idx) = i;

            // apply new row and existing column scaling factors to both ColSet and RowSet
            if(scale)
               vec.value(j) = spxLdexp(vec.value(j), newRowScaleExp + colscaleExp[k]);

            col->value(idx) = vec.value(j);
         }
      }

#ifndef NDEBUG

      for(i = 0; i < nCols(); ++i)
         assert(newCols[i] == 0);

#endif

      assert(SPxLPBase<R>::isConsistent());

      assert(set.num() == nRows() - oldRowNumber);
      addedRows(nRows() - oldRowNumber);
      addedCols(nCols() - oldColNumber);
   }